

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall soul::StructuralParser::parseWhileLoop(StructuralParser *this)

{
  LoopStatement *pLVar1;
  Expression *pEVar2;
  Block *pBVar3;
  Context local_30;
  
  getContext(&local_30,this);
  pLVar1 = allocate<soul::AST::LoopStatement,soul::AST::Context>(this,&local_30);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_30);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  pEVar2 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
  (pLVar1->condition).object = pEVar2;
  pBVar3 = parseStatementAsNewBlock(this);
  (pLVar1->body).object = &pBVar3->super_Statement;
  return &pLVar1->super_Statement;
}

Assistant:

AST::Statement& parseWhileLoop()
    {
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());

        expect (Operator::openParen);
        loopStatement.condition = matchCloseParen (parseExpression());
        loopStatement.body = parseStatementAsNewBlock();

        return loopStatement;
    }